

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int luaG_getfuncline(Proto *f,int pc)

{
  long lVar1;
  AbsLineInfo *pAVar2;
  AbsLineInfo *pAVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  
  if (f->lineinfo == (ls_byte *)0x0) {
    return -1;
  }
  iVar5 = f->sizeabslineinfo;
  lVar6 = (long)iVar5;
  if ((lVar6 == 0) || (pAVar3 = f->abslineinfo, pc < pAVar3->pc)) {
    piVar7 = &f->linedefined;
    iVar5 = -1;
  }
  else {
    iVar4 = pc + 0x7f;
    if (-1 < pc) {
      iVar4 = pc;
    }
    iVar4 = iVar4 >> 7;
    lVar8 = (long)iVar4;
    if (iVar4 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 + -1;
    if (lVar6 <= lVar8) {
      lVar6 = lVar8;
    }
    do {
      if (lVar6 == lVar8) goto LAB_00109f00;
      lVar1 = lVar8 + 1;
      pAVar2 = pAVar3 + lVar8;
      lVar8 = lVar1;
    } while (pAVar2->pc <= pc);
    iVar4 = (int)lVar1 + -2;
LAB_00109f00:
    piVar7 = &pAVar3[iVar4].line;
    iVar5 = pAVar3[iVar4].pc;
  }
  iVar4 = *piVar7;
  if (iVar5 < pc) {
    lVar6 = (long)iVar5;
    do {
      lVar8 = lVar6 + 1;
      lVar6 = lVar6 + 1;
      iVar4 = iVar4 + f->lineinfo[lVar8];
    } while (pc != lVar6);
  }
  return iVar4;
}

Assistant:

int luaG_getfuncline (const Proto *f, int pc) {
  if (f->lineinfo == NULL)  /* no debug information? */
    return -1;
  else {
    int basepc;
    int baseline = getbaseline(f, pc, &basepc);
    while (basepc++ < pc) {  /* walk until given instruction */
      lua_assert(f->lineinfo[basepc] != ABSLINEINFO);
      baseline += f->lineinfo[basepc];  /* correct line */
    }
    return baseline;
  }
}